

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O2

void __thiscall leveldb::BlockHandle::EncodeTo(BlockHandle *this,string *dst)

{
  uint __line;
  char *__assertion;
  
  if (this->offset_ == 0xffffffffffffffff) {
    __assertion = "offset_ != ~static_cast<uint64_t>(0)";
    __line = 0x11;
  }
  else {
    if (this->size_ != 0xffffffffffffffff) {
      PutVarint64(dst,this->offset_);
      PutVarint64(dst,this->size_);
      return;
    }
    __assertion = "size_ != ~static_cast<uint64_t>(0)";
    __line = 0x12;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/format.cc"
                ,__line,"void leveldb::BlockHandle::EncodeTo(std::string *) const");
}

Assistant:

void BlockHandle::EncodeTo(std::string* dst) const {
  // Sanity check that all fields have been set
  assert(offset_ != ~static_cast<uint64_t>(0));
  assert(size_ != ~static_cast<uint64_t>(0));
  PutVarint64(dst, offset_);
  PutVarint64(dst, size_);
}